

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O0

void __thiscall EditorInterface::showFileDialog(EditorInterface *this,bool openFile,path *filename)

{
  element_type *peVar1;
  element_type *this_00;
  element_type *peVar2;
  Vector2f *pVVar3;
  Widget *this_01;
  byte in_SIL;
  shared_ptr<gui::Button> fileSubmitButton;
  shared_ptr<gui::MultilineTextBox> fileTextBox;
  shared_ptr<gui::Label> fileTitle;
  element_type *fileDialogPtr;
  shared_ptr<gui::DialogBox> fileDialog;
  float in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc5c;
  Button *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *in_stack_fffffffffffffc70;
  String *in_stack_fffffffffffffc78;
  MultilineTextBox *in_stack_fffffffffffffc80;
  ContainerBase *in_stack_fffffffffffffc88;
  locale *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  Widget *in_stack_fffffffffffffcb0;
  float local_290;
  float local_28c;
  float local_288;
  float local_284 [3];
  element_type *local_278;
  locale local_260 [40];
  locale local_238 [8];
  string local_230 [64];
  locale local_1f0 [48];
  element_type *local_1c0;
  locale local_1a8 [40];
  locale local_180 [8];
  string local_178 [64];
  locale local_138 [40];
  locale local_110 [56];
  locale local_d8 [56];
  locale local_a0 [56];
  element_type *local_68;
  locale local_50 [40];
  __shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2> local_28;
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ad8c4);
  ::gui::Widget::sendToFront(in_stack_fffffffffffffcb0);
  peVar1 = std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ad8dd);
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar1,1);
  std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ad8fb);
  std::locale::locale(local_50);
  sf::String::String((String *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0);
  ::gui::ContainerBase::getChild<gui::DialogBox>
            (in_stack_fffffffffffffc88,(String *)in_stack_fffffffffffffc80,
             SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
  sf::String::~String((String *)0x1ad967);
  std::locale::~locale(local_50);
  local_68 = std::__shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>::get(&local_28);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ad99e);
  std::locale::locale(local_a0);
  sf::String::String((String *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0);
  ::gui::ContainerBase::getChild<gui::Label>
            (in_stack_fffffffffffffc88,(String *)in_stack_fffffffffffffc80,
             SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
  sf::String::~String((String *)0x1ada0a);
  std::locale::~locale(local_a0);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ada24);
  std::locale::locale(local_d8);
  sf::String::String((String *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0);
  ::gui::ContainerBase::getChild<gui::MultilineTextBox>
            (in_stack_fffffffffffffc88,(String *)in_stack_fffffffffffffc80,
             SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
  sf::String::~String((String *)0x1ada90);
  std::locale::~locale(local_d8);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1adaaa);
  std::locale::locale(local_110);
  sf::String::String((String *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0);
  ::gui::ContainerBase::getChild<gui::Button>
            (in_stack_fffffffffffffc88,(String *)in_stack_fffffffffffffc80,
             SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
  sf::String::~String((String *)0x1adb16);
  std::locale::~locale(local_110);
  if ((local_9 & 1) == 0) {
    std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1adfb4
              );
    std::locale::locale(local_1f0);
    sf::String::String((String *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                       in_stack_fffffffffffffca0);
    ::gui::Label::setLabel
              ((Label *)in_stack_fffffffffffffc60,
               (String *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    sf::String::~String((String *)0x1ae00d);
    std::locale::~locale(local_1f0);
    std::__shared_ptr_access<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ae027);
    ghc::filesystem::path::string_abi_cxx11_
              ((path *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    std::locale::locale(local_238);
    sf::String::String((String *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       in_stack_fffffffffffffca0);
    ::gui::MultilineTextBox::setText(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    sf::String::~String((String *)0x1ae092);
    std::locale::~locale(local_238);
    std::__cxx11::string::~string(local_230);
    this_00 = std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ae0b9);
    std::locale::locale(local_260);
    sf::String::String((String *)this_00,(char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0
                      );
    ::gui::Button::setLabel
              (in_stack_fffffffffffffc60,
               (String *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    sf::String::~String((String *)0x1ae10c);
    std::locale::~locale(local_260);
    std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ae126);
    ::gui::Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::disconnectAll
              ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)0x1ae135);
    std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ae144);
    local_278 = local_68;
    std::shared_ptr<gui::MultilineTextBox>::shared_ptr
              ((shared_ptr<gui::MultilineTextBox> *)in_stack_fffffffffffffc60,
               (shared_ptr<gui::MultilineTextBox> *)
               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    ::gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
    connect<EditorInterface::showFileDialog(bool,ghc::filesystem::path_const&)::__1>
              (in_stack_fffffffffffffc70,
               (anon_class_32_3_ac1fbcab *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    showFileDialog(bool,ghc::filesystem::path_const&)::$_1::~__1
              ((anon_class_32_3_ac1fbcab *)0x1ae1a9);
  }
  else {
    std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1adb3e
              );
    std::locale::locale(local_138);
    sf::String::String((String *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                       in_stack_fffffffffffffca0);
    ::gui::Label::setLabel
              ((Label *)in_stack_fffffffffffffc60,
               (String *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    sf::String::~String((String *)0x1adb9d);
    std::locale::~locale(local_138);
    std::__shared_ptr_access<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1adbb7);
    ghc::filesystem::path::string_abi_cxx11_
              ((path *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    std::locale::locale(local_180);
    sf::String::String((String *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       in_stack_fffffffffffffca0);
    ::gui::MultilineTextBox::setText(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    sf::String::~String((String *)0x1adc2e);
    std::locale::~locale(local_180);
    std::__cxx11::string::~string(local_178);
    std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1adc55);
    std::locale::locale(local_1a8);
    sf::String::String((String *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                       in_stack_fffffffffffffca0);
    ::gui::Button::setLabel
              (in_stack_fffffffffffffc60,
               (String *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    sf::String::~String((String *)0x1adcb4);
    std::locale::~locale(local_1a8);
    std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1adcce);
    ::gui::Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::disconnectAll
              ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)0x1adcdd);
    std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1adcec);
    local_1c0 = local_68;
    std::shared_ptr<gui::MultilineTextBox>::shared_ptr
              ((shared_ptr<gui::MultilineTextBox> *)in_stack_fffffffffffffc60,
               (shared_ptr<gui::MultilineTextBox> *)
               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    ::gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
    connect<EditorInterface::showFileDialog(bool,ghc::filesystem::path_const&)::__0>
              (in_stack_fffffffffffffc70,
               (anon_class_32_3_ac1fbcab *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    showFileDialog(bool,ghc::filesystem::path_const&)::$_0::~__0
              ((anon_class_32_3_ac1fbcab *)0x1add57);
  }
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ae2ce);
  peVar2 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ae2dd);
  ::gui::DialogBox::getSize(peVar2);
  ::gui::DialogBox::setSize
            ((DialogBox *)in_stack_fffffffffffffc60,
             (Vector2f *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  peVar2 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ae30a);
  (*(peVar2->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar2,1);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ae32a);
  local_284[0] = 80.0;
  peVar1 = std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ae34f);
  pVVar3 = ::gui::Panel::getSize(peVar1);
  local_288 = pVVar3->x * 0.5;
  std::min<float>(local_284,&local_288);
  local_28c = 80.0;
  peVar1 = std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ae3c3);
  pVVar3 = ::gui::Panel::getSize(peVar1);
  local_290 = pVVar3->y * 0.5;
  this_01 = (Widget *)std::min<float>(&local_28c,&local_290);
  ::gui::Widget::setPosition(this_01,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ae435);
  std::shared_ptr<gui::MultilineTextBox>::~shared_ptr((shared_ptr<gui::MultilineTextBox> *)0x1ae442)
  ;
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ae44f);
  std::shared_ptr<gui::DialogBox>::~shared_ptr((shared_ptr<gui::DialogBox> *)0x1ae45c);
  return;
}

Assistant:

void EditorInterface::showFileDialog(bool openFile, const fs::path& filename) {
    modalBackground_->sendToFront();
    modalBackground_->setVisible(true);
    auto fileDialog = modalBackground_->getChild<gui::DialogBox>("fileDialog");
    auto fileDialogPtr = fileDialog.get();
    auto fileTitle = fileDialog->getChild<gui::Label>("fileTitle");
    auto fileTextBox = fileDialog->getChild<gui::MultilineTextBox>("fileTextBox");
    auto fileSubmitButton = fileDialog->getChild<gui::Button>("fileSubmitButton");

    if (openFile) {
        fileTitle->setLabel("Open File");
        fileTextBox->setText(filename.string());
        fileSubmitButton->setLabel("Open");
        fileSubmitButton->onClick.disconnectAll();
        fileSubmitButton->onClick.connect([this,fileDialogPtr,fileTextBox]() {
            fileDialogPtr->setVisible(false);
            modalBackground_->setVisible(false);
            if (!fileTextBox->getText().isEmpty()) {
                editor_.openBoard(true, fileTextBox->getText().toAnsiString());
            }
        });
    } else {
        fileTitle->setLabel("Save As");
        fileTextBox->setText(filename.string());
        fileSubmitButton->setLabel("Save");
        fileSubmitButton->onClick.disconnectAll();
        fileSubmitButton->onClick.connect([this,fileDialogPtr,fileTextBox]() {
            fileDialogPtr->setVisible(false);
            modalBackground_->setVisible(false);
            if (!fileTextBox->getText().isEmpty()) {
                editor_.saveAsBoard(fileTextBox->getText().toAnsiString());
            }
        });
    }

    // Force dialog to reposition widgets since labels changed.
    fileDialog->setSize(fileDialog->getSize());

    fileDialog->setVisible(true);
    fileDialog->setPosition(
        std::min(80.0f, modalBackground_->getSize().x / 2.0f),
        std::min(80.0f, modalBackground_->getSize().y / 2.0f)
    );
}